

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_invert_loop(IT_CHANNEL *channel,IT_SAMPLE *sample)

{
  long lVar1;
  IT_SAMPLE *sample_local;
  IT_CHANNEL *channel_local;
  
  channel->inv_loop_delay = channel->inv_loop_delay + ""[channel->inv_loop_speed];
  if ((((0x7f < channel->inv_loop_delay) &&
       (channel->inv_loop_delay = '\0', sample != (IT_SAMPLE *)0x0)) &&
      ((sample->flags & 0x11) == 0x11)) &&
     (((sample->flags & 6) == 0 && (3 < sample->loop_end - sample->loop_start)))) {
    channel->inv_loop_offset = channel->inv_loop_offset + 1;
    if (sample->loop_end - sample->loop_start <= channel->inv_loop_offset) {
      channel->inv_loop_offset = 0;
    }
    lVar1 = (long)(sample->loop_start + channel->inv_loop_offset);
    *(byte *)((long)sample->data + lVar1) = *(byte *)((long)sample->data + lVar1) ^ 0xff;
  }
  return;
}

Assistant:

static void update_invert_loop(IT_CHANNEL *channel, IT_SAMPLE *sample)
{
	channel->inv_loop_delay += pt_tab_invloop[channel->inv_loop_speed];
	if (channel->inv_loop_delay >= 0x80)
	{
		channel->inv_loop_delay = 0;

		if (sample && ((sample->flags & (IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP)) == (IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP)) && !(sample->flags & (IT_SAMPLE_STEREO | IT_SAMPLE_16BIT)))
		{
			if (sample->loop_end - sample->loop_start >= 4)
			{
				channel->inv_loop_offset++;
				if (channel->inv_loop_offset >= (sample->loop_end - sample->loop_start)) channel->inv_loop_offset = 0;

				((char *)sample->data)[sample->loop_start + channel->inv_loop_offset] ^= 0xFF;
			}
		}
	}
}